

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O0

_Bool cpu_mips_hw_interrupts_pending(CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  uint uVar2;
  bool local_19;
  _Bool r;
  int32_t status;
  int32_t pending;
  CPUMIPSState_conflict5 *env_local;
  
  uVar1 = env->CP0_Cause & 0xff00;
  uVar2 = env->CP0_Status & 0xff00;
  if ((env->CP0_Config3 & 0x40U) == 0) {
    local_19 = (uVar1 & uVar2) != 0;
  }
  else {
    local_19 = uVar2 < uVar1;
  }
  return local_19;
}

Assistant:

static inline bool cpu_mips_hw_interrupts_pending(CPUMIPSState *env)
{
    int32_t pending;
    int32_t status;
    bool r;

    pending = env->CP0_Cause & CP0Ca_IP_mask;
    status = env->CP0_Status & CP0Ca_IP_mask;

    if (env->CP0_Config3 & (1 << CP0C3_VEIC)) {
        /*
         * A MIPS configured with a vectorizing external interrupt controller
         * will feed a vector into the Cause pending lines. The core treats
         * the status lines as a vector level, not as indiviual masks.
         */
        r = pending > status;
    } else {
        /*
         * A MIPS configured with compatibility or VInt (Vectored Interrupts)
         * treats the pending lines as individual interrupt lines, the status
         * lines are individual masks.
         */
        r = (pending & status) != 0;
    }
    return r;
}